

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall soplex::SVSetBase<double>::deleteVec(SVSetBase<double> *this,DLPSV *ps)

{
  DLPSV *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  SVSetBase<double> *pSVar4;
  SVSetBase<double> *pSVar5;
  DLPSV **ppDVar6;
  SVSetBase<double> *in_RSI;
  ClassArray<soplex::Nonzero<double>_> *in_RDI;
  int sz;
  SVectorBase<double> *prev;
  DLPSV *elmem;
  int in_stack_ffffffffffffffbc;
  SVSetBase<double> *in_stack_ffffffffffffffc0;
  
  pSVar4 = (SVSetBase<double> *)
           IdList<soplex::SVSetBase<double>::DLPSV>::last
                     ((IdList<soplex::SVSetBase<double>::DLPSV> *)(in_RDI + 2));
  if (in_RSI == pSVar4) {
    iVar1 = SVectorBase<double>::max((SVectorBase<double> *)in_RSI);
    ClassArray<soplex::Nonzero<double>_>::removeLast(in_RDI,iVar1);
    SVectorBase<double>::size((SVectorBase<double> *)in_RSI);
    SVectorBase<double>::max((SVectorBase<double> *)in_RSI);
    updateUnusedMemEstimation(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  else {
    pSVar4 = in_RSI;
    pSVar5 = (SVSetBase<double> *)
             IdList<soplex::SVSetBase<double>::DLPSV>::first
                       ((IdList<soplex::SVSetBase<double>::DLPSV> *)(in_RDI + 2));
    if (pSVar4 == pSVar5) {
      SVectorBase<double>::size((SVectorBase<double> *)in_RSI);
      updateUnusedMemEstimation(pSVar4,in_stack_ffffffffffffffbc);
    }
    else {
      ppDVar6 = DLPSV::prev((DLPSV *)in_RSI);
      this_00 = *ppDVar6;
      iVar1 = SVectorBase<double>::size(&this_00->super_SVectorBase<double>);
      elmem = this_00;
      iVar2 = SVectorBase<double>::max(&this_00->super_SVectorBase<double>);
      iVar3 = SVectorBase<double>::max((SVectorBase<double> *)in_RSI);
      iVar2 = iVar2 + iVar3;
      SVectorBase<double>::mem(&this_00->super_SVectorBase<double>);
      SVectorBase<double>::setMem((SVectorBase<double> *)pSVar4,iVar2,(Nonzero<double> *)elmem);
      SVectorBase<double>::set_size(&this_00->super_SVectorBase<double>,iVar1);
      SVectorBase<double>::size((SVectorBase<double> *)in_RSI);
      updateUnusedMemEstimation(pSVar4,iVar2);
    }
  }
  IdList<soplex::SVSetBase<double>::DLPSV>::remove
            ((IdList<soplex::SVSetBase<double>::DLPSV> *)(in_RDI + 2),(char *)in_RSI);
  return;
}

Assistant:

void deleteVec(DLPSV* ps)
   {
      /* delete last entries */
      if(ps == list.last())
      {
         SVSetBaseArray::removeLast(ps->max());

         // decrease counter of unused memory
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "deleteVec (1), this = {} : updateUnusedMemEstimation -= {}\n", (void*)this,
                       ps->max() - ps->size());
#endif
         updateUnusedMemEstimation(ps->size() - ps->max());
      }
      /* merge space of predecessor with position which will be deleted, therefore we do not need to delete any memory
       * or do an expensive memory reallocation
       */
      else if(ps != list.first())
      {
         SVectorBase<R>* prev = ps->prev();
         int sz = prev->size();

         prev->setMem(prev->max() + ps->max(), prev->mem());
         prev->set_size(sz);

         // increase counter of unused memory
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "deleteVec (2), this = {} : updateUnusedMemEstimation += {}\n", (void*)this,
                       ps->size());
#endif
         updateUnusedMemEstimation(ps->size());
      }
      /* simply remove the front entries; we do not shift the second vector to the front, because we count the unused
       * memory exactly and rely on the automatic call of memPack()
       */
      else
      {
         // increase counter of unused memory
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "deleteVec (3), this = {} : updateUnusedMemEstimation += {}\n", (void*)this,
                       ps->size());
#endif
         updateUnusedMemEstimation(ps->size());
      }

      list.remove(ps);
   }